

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::EmitObject
               (SnapObject *snpObject,FileWriter *writer,Separator separator,
               SnapObjectVTable *vtable,ThreadContext *threadContext)

{
  SnapObjectType SVar1;
  SnapHandler *pSVar2;
  bool bVar3;
  DependsOnInfo *pDVar4;
  _func_int **pp_Var5;
  undefined7 in_register_00000011;
  byte bVar6;
  ulong uVar7;
  
  (*writer->_vptr_FileWriter[6])(writer,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  (*writer->_vptr_FileWriter[8])(writer,1);
  FileWriter::WriteAddr(writer,objectId,snpObject->ObjectPtrId,NoSeparator);
  SVar1 = snpObject->SnapObjectTag;
  (*writer->_vptr_FileWriter[3])(writer,0x22,1);
  (*writer->_vptr_FileWriter[0x14])(writer,(ulong)SVar1,0);
  (*writer->_vptr_FileWriter[0xc])
            (writer,0x19,(ulong)(snpObject->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0),1);
  if (snpObject->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0) {
    FileWriter::WriteWellKnownToken
              (writer,wellKnownToken,snpObject->OptWellKnownToken,CommaSeparator);
  }
  FileWriter::WriteAddr(writer,typeId,snpObject->SnapType->TypePtrId,CommaSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,0x1b,(ulong)(snpObject->IsCrossSite != 0),1);
  (*writer->_vptr_FileWriter[0xc])
            (writer,0x4d,(ulong)(snpObject->OptDependsOnInfo != (DependsOnInfo *)0x0),1);
  if (snpObject->OptDependsOnInfo != (DependsOnInfo *)0x0) {
    FileWriter::WriteLengthValue(writer,snpObject->OptDependsOnInfo->DepOnCount,CommaSeparator);
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    pDVar4 = snpObject->OptDependsOnInfo;
    if (pDVar4->DepOnCount != 0) {
      uVar7 = 0;
      do {
        (*writer->_vptr_FileWriter[0x12])(writer,pDVar4->DepOnPtrArray[uVar7],(ulong)(uVar7 != 0));
        uVar7 = uVar7 + 1;
        pDVar4 = snpObject->OptDependsOnInfo;
      } while (uVar7 < pDVar4->DepOnCount);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
  }
  bVar3 = Js::DynamicType::Is(snpObject->SnapType->JsTypeId);
  if (bVar3) {
    pSVar2 = snpObject->SnapType->TypeHandlerInfo;
    FileWriter::WriteAddr(writer,objectId,snpObject->OptIndexedObjectArray,CommaSeparator);
    if (pSVar2->MaxPropertyIndex == 0) {
      FileWriter::WriteLengthValue(writer,snpObject->VarArrayCount,CommaSeparator);
    }
    else {
      FileWriter::WriteLengthValue(writer,pSVar2->MaxPropertyIndex,CommaAndBigSpaceSeparator);
      FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
      (*writer->_vptr_FileWriter[8])(writer,1);
      if (pSVar2->MaxPropertyIndex != 0) {
        uVar7 = 0;
        do {
          bVar6 = uVar7 == 0 ^ 3;
          if (pSVar2->PropertyInfoArray[uVar7].DataKind == Clear) {
            pp_Var5 = writer->_vptr_FileWriter + 10;
          }
          else {
            (*writer->_vptr_FileWriter[6])(writer,(ulong)bVar6);
            bVar6 = 0;
            FileWriter::WriteUInt32
                      (writer,pid,pSVar2->PropertyInfoArray[uVar7].PropertyRecordId,NoSeparator);
            (*writer->_vptr_FileWriter[3])(writer,3,1);
            NSSnapValues::EmitTTDVar(snpObject->VarArray[uVar7],writer,NoSeparator);
            pp_Var5 = writer->_vptr_FileWriter + 7;
          }
          (**pp_Var5)(writer,(ulong)bVar6);
          uVar7 = uVar7 + 1;
        } while (uVar7 < pSVar2->MaxPropertyIndex);
      }
      (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
      (*writer->_vptr_FileWriter[5])(writer,2);
    }
  }
  if (vtable[snpObject->SnapObjectTag].EmitAddtlInfoFunc != (fPtr_EmitAddtlInfo)0x0) {
    (*vtable[snpObject->SnapObjectTag].EmitAddtlInfoFunc)(snpObject,writer);
  }
  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
  (*writer->_vptr_FileWriter[7])(writer,2);
  return;
}

Assistant:

void EmitObject(const SnapObject* snpObject, FileWriter* writer, NSTokens::Separator separator, const SnapObjectVTable* vtable, ThreadContext* threadContext)
        {
            writer->WriteRecordStart(separator);
            writer->AdjustIndent(1);

            writer->WriteAddr(NSTokens::Key::objectId, snpObject->ObjectPtrId);
            writer->WriteTag<SnapObjectType>(NSTokens::Key::objectType, snpObject->SnapObjectTag, NSTokens::Separator::CommaSeparator);

            writer->WriteBool(NSTokens::Key::isWellKnownToken, snpObject->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN, NSTokens::Separator::CommaSeparator);
            if(snpObject->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN)
            {
                writer->WriteWellKnownToken(NSTokens::Key::wellKnownToken, snpObject->OptWellKnownToken, NSTokens::Separator::CommaSeparator);
            }

            writer->WriteAddr(NSTokens::Key::typeId, snpObject->SnapType->TypePtrId, NSTokens::Separator::CommaSeparator);

            writer->WriteBool(NSTokens::Key::isCrossSite, !!snpObject->IsCrossSite, NSTokens::Separator::CommaSeparator);

#if ENABLE_OBJECT_SOURCE_TRACKING
            writer->WriteKey(NSTokens::Key::originInfo, NSTokens::Separator::CommaSeparator);
            EmitDiagnosticOriginInformation(snpObject->DiagOriginInfo, writer, NSTokens::Separator::NoSeparator);
#endif

            writer->WriteBool(NSTokens::Key::isDepOn, snpObject->OptDependsOnInfo != nullptr, NSTokens::Separator::CommaSeparator);
            if(snpObject->OptDependsOnInfo != nullptr)
            {
                writer->WriteLengthValue(snpObject->OptDependsOnInfo->DepOnCount, NSTokens::Separator::CommaSeparator);
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = 0; i < snpObject->OptDependsOnInfo->DepOnCount; ++i)
                {
                    writer->WriteNakedAddr(snpObject->OptDependsOnInfo->DepOnPtrArray[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
                }
                writer->WriteSequenceEnd();
            }

            if(Js::DynamicType::Is(snpObject->SnapType->JsTypeId))
            {
                const NSSnapType::SnapHandler* handler = snpObject->SnapType->TypeHandlerInfo;

                writer->WriteAddr(NSTokens::Key::objectId, snpObject->OptIndexedObjectArray, NSTokens::Separator::CommaSeparator);

                if(handler->MaxPropertyIndex == 0)
                {
                    writer->WriteLengthValue(snpObject->VarArrayCount, NSTokens::Separator::CommaSeparator);
                }
                else
                {
                    writer->WriteLengthValue(handler->MaxPropertyIndex, NSTokens::Separator::CommaAndBigSpaceSeparator);
                    writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                    writer->AdjustIndent(1);
                    for(uint32 i = 0; i < handler->MaxPropertyIndex; ++i)
                    {
                        NSTokens::Separator varSep = i != 0 ? NSTokens::Separator::CommaAndBigSpaceSeparator : NSTokens::Separator::BigSpaceSeparator;

                        if(handler->PropertyInfoArray[i].DataKind == NSSnapType::SnapEntryDataKindTag::Clear)
                        {
                            writer->WriteNakedNull(varSep);
                        }
                        else
                        {
#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                            writer->WriteRecordStart(varSep);
                            writer->WriteUInt32(NSTokens::Key::pid, (uint32)handler->PropertyInfoArray[i].PropertyRecordId, NSTokens::Separator::NoSeparator);
                            writer->WriteKey(NSTokens::Key::entry, NSTokens::Separator::CommaSeparator);

                            varSep = NSTokens::Separator::NoSeparator;
#endif

                            NSSnapValues::EmitTTDVar(snpObject->VarArray[i], writer, varSep);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                            writer->WriteRecordEnd();
#endif
                        }
                    }
                    writer->AdjustIndent(-1);
                    writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);
                }
            }

            fPtr_EmitAddtlInfo addtlInfoEmit = vtable[(uint32)snpObject->SnapObjectTag].EmitAddtlInfoFunc;
            if(addtlInfoEmit != nullptr)
            {
                addtlInfoEmit(snpObject, writer);
            }

            writer->AdjustIndent(-1);
            writer->WriteRecordEnd(NSTokens::Separator::BigSpaceSeparator);
        }